

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O1

unique_ptr<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>_>
 __thiscall booster::locale::impl_posix::create_iconv_converter(impl_posix *this,string *encoding)

{
  mb2_iconv_converter *this_00;
  pointer *__ptr;
  
  *(undefined8 *)this = 0;
  this_00 = (mb2_iconv_converter *)operator_new(0x48);
  mb2_iconv_converter::mb2_iconv_converter(this_00,encoding);
  *(mb2_iconv_converter **)this = this_00;
  return (__uniq_ptr_data<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>,_true,_true>
          )(__uniq_ptr_data<booster::locale::util::base_converter,_std::default_delete<booster::locale::util::base_converter>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<util::base_converter> create_iconv_converter(std::string const &encoding)
    {
        std::unique_ptr<util::base_converter> cvt;
        try {
            cvt.reset(new mb2_iconv_converter(encoding));
        }
        catch(std::exception const &e) {
            // Nothing to do, just retrun empty cvt
        }
        return cvt;
    }